

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O3

void __thiscall
ServerService::startBroadcast(ServerService *this,sockaddr_in *peerAddr,char *msg,int sleepSecond)

{
  ssize_t sVar1;
  long lVar2;
  char *pcVar3;
  
  sVar1 = sendto(this->broadcastFD,msg,8,0,(sockaddr *)peerAddr,0x10);
  if (sVar1 == -1) {
    pcVar3 = "Send Broadcast Error";
    lVar2 = 0x14;
  }
  else {
    pcVar3 = "Send Broadcast Success";
    lVar2 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  sleep(sleepSecond);
  return;
}

Assistant:

void ServerService::startBroadcast(struct sockaddr_in *peerAddr, char* msg, int sleepSecond) {
    //    char msg[100] = "Msg from udp broadcast client!";
    if (-1 != sendto(broadcastFD, msg, sizeof(msg), 0, (struct sockaddr *) peerAddr, sizeof(struct sockaddr_in))) {
        cout << "Send Broadcast Success" << endl;
    } else {
        cout << "Send Broadcast Error" << endl;
    }
    sleep(sleepSecond);
}